

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_bar.cpp
# Opt level: O0

void __thiscall BmsBarManager::SetResolution(BmsBarManager *this,double d)

{
  int local_1c;
  int i;
  double d_local;
  BmsBarManager *this_local;
  
  this->barresolution_ = (uint)(long)((double)this->barresolution_ * d);
  for (local_1c = 0; local_1c < 1000; local_1c = local_1c + 1) {
    this->barcount_[local_1c] = (uint)(long)((double)this->barcount_[local_1c] * d);
  }
  InvalidateCache(this);
  return;
}

Assistant:

void
BmsBarManager::SetResolution(double d)
{
	barresolution_ *= d;

	// make every cache size reseted and InvalidateCache
	for (int i = 0; i < BmsConst::BAR_MAX_COUNT; i++)
		barcount_[i] *= d;

	// invalidate cache
	InvalidateCache();
}